

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestCase *pTVar3;
  pointer pcVar4;
  IStreamingReporter *pIVar5;
  SectionInfo testCaseSection;
  AssertionResultData tempResult;
  AssertionResult result;
  Counts assertions;
  SectionStats testCaseSectionStats;
  Totals deltaTotals;
  string local_3b0;
  string local_390;
  SectionInfo local_370;
  AssertionResultData local_320;
  undefined1 local_2c8 [8];
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [24];
  int local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [13];
  AssertionResult local_198;
  Counts local_108;
  SectionStats local_e8;
  Totals local_68;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  local_320.message._M_dataplus._M_p = (pointer)&local_320.message.field_2;
  local_320.message._M_string_length = 0;
  local_320.message.field_2._M_local_buf[0] = '\0';
  local_320.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_320.reconstructedExpression.field_2;
  local_320.reconstructedExpression._M_string_length = 0;
  local_320.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_320.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_320.lazyExpression.m_isNegated = false;
  local_320.resultType = FatalErrorCondition;
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,message.m_start,message.m_start + message.m_size);
  std::__cxx11::string::operator=((string *)&local_320,(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
  }
  AssertionResult::AssertionResult(&local_198,&this->m_lastAssertionInfo,&local_320);
  assertionEnded(this,&local_198);
  handleUnfinishedSections(this);
  pTVar3 = this->m_activeTestCase;
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  pcVar4 = (pTVar3->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,pcVar4,pcVar4 + (pTVar3->super_TestCaseInfo).name._M_string_length
            );
  paVar2 = &local_370.description.field_2;
  local_370.description._M_string_length = 0;
  local_370.description.field_2._M_local_buf[0] = '\0';
  local_370.lineInfo.file = (pTVar3->super_TestCaseInfo).lineInfo.file;
  local_370.lineInfo.line = (pTVar3->super_TestCaseInfo).lineInfo.line;
  local_108.passed = 0;
  local_108.failedButOk = 0;
  local_108.failed = 1;
  local_370.description._M_dataplus._M_p = (pointer)paVar2;
  SectionStats::SectionStats(&local_e8,&local_370,&local_108,0.0,false);
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar5->_vptr_IStreamingReporter[0xb])(pIVar5,&local_e8);
  local_68.error = 0;
  local_68.testCases.failedButOk = 0;
  local_68.assertions.passed = 0;
  local_68.assertions.failedButOk = 0;
  local_68.testCases.passed = 0;
  local_68.testCases.failed = 1;
  local_68.assertions.failed = 1;
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_2c8,&this->m_activeTestCase->super_TestCaseInfo,&local_68,
             &local_390,&local_3b0,false);
  (*pIVar5->_vptr_IStreamingReporter[0xc])(pIVar5,local_2c8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_2c0._M_p = (pointer)0x0;
  local_2b8[0] = '\0';
  local_2c8 = (undefined1  [8])local_2b8;
  testGroupEnded(this,(string *)local_2c8,&this->m_totals,1,1);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
  }
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_2c8 = (undefined1  [8])&PTR__TestRunStats_0022ba20;
  pcVar4 = (this->m_runInfo).name._M_dataplus._M_p;
  local_2c0._M_p = local_2b8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar4,pcVar4 + (this->m_runInfo).name._M_string_length);
  local_270[0]._0_8_ = (this->m_totals).testCases.failedButOk;
  local_2a0 = (this->m_totals).error;
  uStack_29c = *(undefined4 *)&(this->m_totals).field_0x4;
  uStack_298 = (undefined4)(this->m_totals).assertions.passed;
  uStack_294 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  local_290._M_allocated_capacity._0_4_ = (undefined4)(this->m_totals).assertions.failed;
  local_290._M_allocated_capacity._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_290._8_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_290._12_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_280 = (undefined4)(this->m_totals).testCases.passed;
  uStack_27c = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  uStack_278 = (undefined4)(this->m_totals).testCases.failed;
  uStack_274 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_270[0]._M_local_buf[8] = '\0';
  (*pIVar5->_vptr_IStreamingReporter[0xe])(pIVar5);
  local_2c8 = (undefined1  [8])&PTR__TestRunStats_0022ba20;
  if (local_2c0._M_p != local_2b8 + 8) {
    operator_delete(local_2c0._M_p,local_2b8._8_8_ + 1);
  }
  SectionStats::~SectionStats(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_370.description._M_dataplus._M_p,
                    CONCAT71(local_370.description.field_2._M_allocated_capacity._1_7_,
                             local_370.description.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_198.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_198.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_198.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_resultData.message._M_dataplus._M_p != &local_198.m_resultData.message.field_2)
  {
    operator_delete(local_198.m_resultData.message._M_dataplus._M_p,
                    local_198.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.reconstructedExpression._M_dataplus._M_p !=
      &local_320.reconstructedExpression.field_2) {
    operator_delete(local_320.reconstructedExpression._M_dataplus._M_p,
                    CONCAT71(local_320.reconstructedExpression.field_2._M_allocated_capacity._1_7_,
                             local_320.reconstructedExpression.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.message._M_dataplus._M_p != &local_320.message.field_2) {
    operator_delete(local_320.message._M_dataplus._M_p,
                    CONCAT71(local_320.message.field_2._M_allocated_capacity._1_7_,
                             local_320.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }